

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::
int_writer<int,_fmt::v6::basic_format_specs<char>_>::int_writer
          (int_writer<int,_fmt::v6::basic_format_specs<char>_> *this,
          basic_writer<fmt::v6::buffer_range<char>_> *w,int value,basic_format_specs<char> *s)

{
  bool bVar1;
  undefined8 in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined1 local_29;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RCX;
  *(int *)(in_RDI + 2) = in_EDX;
  *(undefined4 *)(in_RDI + 3) = 0;
  bVar1 = is_negative<int,_0>(in_EDX);
  if (bVar1) {
    *(undefined1 *)((long)in_RDI + 0x14) = 0x2d;
    *(int *)(in_RDI + 3) = *(int *)(in_RDI + 3) + 1;
    *(int *)(in_RDI + 2) = -*(int *)(in_RDI + 2);
  }
  else if (((*(byte *)(in_RDI[1] + 9) >> 4 & 7) != 0) && ((*(byte *)(in_RDI[1] + 9) >> 4 & 7) != 1))
  {
    local_29 = 0x2b;
    if ((*(byte *)(in_RDI[1] + 9) >> 4 & 7) != 2) {
      local_29 = 0x20;
    }
    *(undefined1 *)((long)in_RDI + 0x14) = local_29;
    *(int *)(in_RDI + 3) = *(int *)(in_RDI + 3) + 1;
  }
  return;
}

Assistant:

int_writer(basic_writer<Range>& w, Int value, const Specs& s)
        : writer(w),
          specs(s),
          abs_value(static_cast<unsigned_type>(value)),
          prefix_size(0) {
      if (is_negative(value)) {
        prefix[0] = '-';
        ++prefix_size;
        abs_value = 0 - abs_value;
      } else if (specs.sign != sign::none && specs.sign != sign::minus) {
        prefix[0] = specs.sign == sign::plus ? '+' : ' ';
        ++prefix_size;
      }
    }